

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerGLSL::subpass_input_is_framebuffer_fetch(CompilerGLSL *this,uint32_t id)

{
  uint *puVar1;
  bool bVar2;
  uint32_t uVar3;
  pointer ppVar4;
  bool bVar5;
  
  bVar2 = Compiler::has_decoration(&this->super_Compiler,(ID)id,DecorationInputAttachmentIndex);
  if (bVar2) {
    uVar3 = Compiler::get_decoration(&this->super_Compiler,(ID)id,DecorationInputAttachmentIndex);
    ppVar4 = (this->subpass_to_framebuffer_fetch_attachment).
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar5 = ppVar4 == (this->subpass_to_framebuffer_fetch_attachment).
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
      bVar2 = !bVar5;
      if (bVar5) {
        return bVar2;
      }
      puVar1 = &ppVar4->first;
      ppVar4 = ppVar4 + 1;
    } while (*puVar1 != uVar3);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool CompilerGLSL::subpass_input_is_framebuffer_fetch(uint32_t id) const
{
	if (!has_decoration(id, DecorationInputAttachmentIndex))
		return false;

	uint32_t input_attachment_index = get_decoration(id, DecorationInputAttachmentIndex);
	for (auto &remap : subpass_to_framebuffer_fetch_attachment)
		if (remap.first == input_attachment_index)
			return true;

	return false;
}